

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void deleteInstanceChildren(UA_Server *server,UA_NodeId *objectNodeId)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  size_t i;
  UA_Byte *pUVar4;
  long lVar5;
  UA_BrowseDescription local_168;
  undefined1 local_118 [64];
  anon_union_16_4_621dfe33_for_identifier aStack_d8;
  size_t sStack_c8;
  UA_Byte *local_c0;
  undefined8 uStack_b8;
  UA_Boolean local_b0;
  undefined1 local_a8 [24];
  undefined1 local_90 [8];
  UA_BrowseResult bRes;
  
  local_168.includeSubtypes = false;
  local_168._57_3_ = 0;
  local_168._68_4_ = 0;
  local_168.referenceTypeId.identifier.string.length = 0;
  local_168.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
  local_168.browseDirection = UA_BROWSEDIRECTION_FORWARD;
  local_168._28_4_ = 0;
  local_168.referenceTypeId.namespaceIndex = 0;
  local_168.referenceTypeId._2_2_ = 0;
  local_168.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_168.nodeId.namespaceIndex = objectNodeId->namespaceIndex;
  local_168.nodeId._2_2_ = *(undefined2 *)&objectNodeId->field_0x2;
  local_168.nodeId.identifierType = objectNodeId->identifierType;
  local_168.nodeId.identifier.string.length = (objectNodeId->identifier).string.length;
  local_168.nodeId.identifier.string.data = (objectNodeId->identifier).string.data;
  local_168.nodeClassMask = 7;
  local_168.resultMask = 7;
  lVar5 = 0;
  UA_Server_browse((UA_BrowseResult *)local_90,server,0,&local_168);
  for (pUVar4 = (UA_Byte *)0x0; pUVar4 < bRes.continuationPoint.data; pUVar4 = pUVar4 + 1) {
    iVar3 = *(int *)(bRes.referencesSize + 0x88 + lVar5);
    if (iVar3 - 1U < 2) {
      local_118._16_8_ = *(undefined8 *)(bRes.referencesSize + 0x30 + lVar5);
      puVar1 = (undefined8 *)(bRes.referencesSize + 0x20 + lVar5);
      local_118._0_8_ = *puVar1;
      local_118._8_8_ = puVar1[1];
      deleteNode(server,&adminSession,(UA_NodeId *)local_118,true);
    }
    else if (iVar3 == 4) {
      puVar1 = (undefined8 *)(bRes.referencesSize + lVar5);
      puVar2 = (undefined8 *)(bRes.referencesSize + 0x20 + lVar5);
      local_118._56_8_ = *puVar2;
      aStack_d8.string.length = puVar2[1];
      puVar2 = (undefined8 *)(bRes.referencesSize + 0x30 + lVar5);
      aStack_d8.string.data = (UA_Byte *)*puVar2;
      sStack_c8 = puVar2[1];
      puVar2 = (undefined8 *)(bRes.referencesSize + 0x40 + lVar5);
      local_c0 = (UA_Byte *)*puVar2;
      uStack_b8 = puVar2[1];
      local_118._24_8_ = *puVar1;
      local_118._32_8_ = puVar1[1];
      local_118._40_8_ = puVar1[2];
      local_118._16_8_ = (objectNodeId->identifier).string.data;
      local_118._0_2_ = objectNodeId->namespaceIndex;
      local_118._2_2_ = *(undefined2 *)&objectNodeId->field_0x2;
      local_118._4_4_ = objectNodeId->identifierType;
      local_118._8_8_ = (objectNodeId->identifier).string.length;
      local_118[0x30] = true;
      local_b0 = true;
      local_a8._0_8_ = local_118._24_8_;
      local_a8._8_8_ = local_118._32_8_;
      local_a8._16_8_ = local_118._40_8_;
      bRes.references = (UA_ReferenceDescription *)local_118._56_8_;
      deleteReference(server,&adminSession,(UA_DeleteReferencesItem *)local_118);
    }
    lVar5 = lVar5 + 0xc0;
  }
  UA_BrowseResult_deleteMembers((UA_BrowseResult *)local_90);
  return;
}

Assistant:

static void
deleteInstanceChildren(UA_Server *server, UA_NodeId *objectNodeId) {
    /* Browse for children */
    UA_BrowseDescription bDes;
    UA_BrowseDescription_init(&bDes);
    bDes.nodeId = *objectNodeId;
    bDes.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bDes.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bDes.resultMask = UA_BROWSERESULTMASK_ISFORWARD | UA_BROWSERESULTMASK_NODECLASS | UA_BROWSERESULTMASK_REFERENCETYPEINFO;
    UA_BrowseResult bRes = UA_Server_browse(server, 0, &bDes);

    /* Delete Children */
    for(size_t i=0; i<bRes.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &bRes.references[i];
        if((rd->nodeClass == UA_NODECLASS_OBJECT || rd->nodeClass == UA_NODECLASS_VARIABLE)) {
            UA_Server_deleteNode(server, rd->nodeId.nodeId, true);
        } else if (rd->nodeClass == UA_NODECLASS_METHOD) {
            UA_Server_deleteReference(server, *objectNodeId, rd->referenceTypeId,
                                      true, rd->nodeId, true);
        }
    }

    UA_BrowseResult_deleteMembers(&bRes); 
}